

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

int is_range_multiplier(char *s)

{
  char cVar1;
  uint uVar2;
  ushort **ppuVar3;
  char *pcVar4;
  
  ppuVar3 = __ctype_b_loc();
  uVar2 = 0;
  if (((long)*s != 0x30) && (((*ppuVar3)[*s] & 0x800) != 0)) {
    pcVar4 = s + 1;
    do {
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) != 0);
    uVar2 = (uint)(cVar1 == 'x');
  }
  return uVar2;
}

Assistant:

static int is_range_multiplier(const char* s)
{
    int rval;
    if(isdigit(*s) && *s != '0')
    {
        while(isdigit(*++s)) ;
        rval = (*s == 'x');
    }
    else
        rval = 0;
    return rval;
}